

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionPrivate::removeReply
          (QHttpNetworkConnectionPrivate *this,QHttpNetworkReply *reply)

{
  long *plVar1;
  QObject *obj;
  QHttpNetworkConnectionChannel *pQVar2;
  QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
  *pQVar3;
  QHttpNetworkReply *pQVar4;
  QAbstractProtocolHandler *this_00;
  const_iterator cVar5;
  bool bVar6;
  const_iterator it;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int __fd;
  long lVar10;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar11;
  long in_FS_OFFSET;
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *local_60;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> local_58;
  QUrl local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  obj = *(QObject **)&this->field_0x8;
  pQVar2 = this->channels;
  uVar8 = 0;
  uVar9 = (ulong)(uint)this->activeChannelCount;
  if (this->activeChannelCount < 1) {
    uVar9 = uVar8;
  }
  for (; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    if (pQVar2[uVar8].reply == reply) {
      pQVar2[uVar8].reply = (QHttpNetworkReply *)0x0;
      this_00 = pQVar2[uVar8].protocolHandler._M_t.
                super___uniq_ptr_impl<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                ._M_t.
                super__Tuple_impl<0UL,_QAbstractProtocolHandler_*,_std::default_delete<QAbstractProtocolHandler>_>
                .super__Head_base<0UL,_QAbstractProtocolHandler_*,_false>._M_head_impl;
      if (this_00 != (QAbstractProtocolHandler *)0x0) {
        QAbstractProtocolHandler::setReply(this_00,(QHttpNetworkReply *)0x0);
      }
      QUrl::QUrl(&local_40);
      QHttpNetworkRequest::QHttpNetworkRequest(&local_58.first,&local_40,Get,NormalPriority);
      ppVar11 = &local_58;
      QHttpNetworkRequest::operator=(&this->channels[uVar8].request,&local_58.first);
      __fd = (int)ppVar11;
      QHttpNetworkRequest::~QHttpNetworkRequest(&local_58.first);
      QUrl::~QUrl(&local_40);
      this->channels[uVar8].resendCurrent = false;
      bVar6 = QHttpNetworkReply::isFinished((QHttpNetworkReply *)reply);
      if ((!bVar6) && (this->channels[uVar8].alreadyPipelinedRequests.d.size != 0)) {
        QHttpNetworkConnectionChannel::requeueCurrentlyPipelinedRequests
                  ((QHttpNetworkConnectionChannel *)(this->channels + uVar8));
      }
      bVar6 = QHttpNetworkReplyPrivate::isConnectionCloseEnabled
                        (*(QHttpNetworkReplyPrivate **)&reply->field_0x8);
      if ((bVar6) || (bVar6 = QHttpNetworkReply::isFinished((QHttpNetworkReply *)reply), !bVar6)) {
        bVar6 = QHttpNetworkReply::isAborted((QHttpNetworkReply *)reply);
        if (bVar6) {
          QHttpNetworkConnectionChannel::abort
                    ((QHttpNetworkConnectionChannel *)(this->channels + uVar8));
        }
        else {
          QHttpNetworkConnectionChannel::close
                    ((QHttpNetworkConnectionChannel *)(this->channels + uVar8),__fd);
        }
      }
      QMetaObject::invokeMethod<>(obj,"_q_startNextRequest",QueuedConnection);
      goto LAB_001eccd9;
    }
    lVar10 = 1;
    lVar7 = 0x10;
    while (pQVar2[uVar8].alreadyPipelinedRequests.d.size + lVar10 != 1) {
      lVar10 = lVar10 + -1;
      plVar1 = (long *)((long)&((pQVar2[uVar8].alreadyPipelinedRequests.d.ptr)->first).
                               super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + lVar7);
      lVar7 = lVar7 + 0x18;
      if ((QHttpNetworkReply *)*plVar1 == reply) {
        QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::removeAt
                  (&pQVar2[uVar8].alreadyPipelinedRequests,-lVar10);
        QHttpNetworkConnectionChannel::requeueCurrentlyPipelinedRequests
                  ((QHttpNetworkConnectionChannel *)(this->channels + uVar8));
        pQVar4 = this->channels[uVar8].reply;
        if (pQVar4 != (QHttpNetworkReply *)0x0) {
          *(undefined1 *)(*(long *)&pQVar4->field_0x8 + 0x13a) = 1;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_001eca9d;
        goto LAB_001eccf8;
      }
    }
    pQVar3 = pQVar2[uVar8].h2RequestsToSend.d.d.ptr;
    cVar5._M_node = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar3 == (QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
                   *)0x0) {
      it._M_node = (_Base_ptr)0x0;
      cVar5._M_node = (_Base_ptr)0x0;
    }
    else {
      it._M_node = *(_Base_ptr *)
                    ((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    for (; it._M_node != cVar5._M_node; it._M_node = (_Base_ptr)std::_Rb_tree_increment(it._M_node))
    {
      if (*(QHttpNetworkReply **)((long)it._M_node + 0x38) == reply) {
        QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                  (&pQVar2[uVar8].h2RequestsToSend,(const_iterator)it._M_node);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_001eca9d:
          QMetaObject::invokeMethod<>(obj,"_q_startNextRequest",QueuedConnection);
          return;
        }
        goto LAB_001eccf8;
      }
    }
  }
  uVar9 = (this->highPriorityQueue).d.size;
  if (uVar9 != 0) {
    local_60 = &this->highPriorityQueue;
    uVar9 = uVar9 & 0xffffffff;
    while( true ) {
      uVar9 = uVar9 - 1;
      if ((int)(uint)uVar9 < 0) break;
      uVar8 = (ulong)((uint)uVar9 & 0x7fffffff);
      local_58.second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
           (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_58.first.d.d.ptr =
           (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
                (&local_58,(this->highPriorityQueue).d.ptr + uVar8);
      if (local_58.second == reply) goto LAB_001ecc97;
      QHttpNetworkRequest::~QHttpNetworkRequest(&local_58.first);
    }
  }
  uVar9 = (this->lowPriorityQueue).d.size;
  if (uVar9 != 0) {
    local_60 = &this->lowPriorityQueue;
    uVar9 = uVar9 & 0xffffffff;
    while( true ) {
      uVar9 = uVar9 - 1;
      if ((int)(uint)uVar9 < 0) break;
      uVar8 = (ulong)((uint)uVar9 & 0x7fffffff);
      local_58.second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
           (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_58.first.d.d.ptr =
           (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
                (&local_58,(this->lowPriorityQueue).d.ptr + uVar8);
      if (local_58.second == reply) goto LAB_001ecc97;
      QHttpNetworkRequest::~QHttpNetworkRequest(&local_58.first);
    }
  }
LAB_001eccd9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001eccf8:
  __stack_chk_fail();
LAB_001ecc97:
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::removeAt(local_60,uVar8);
  QMetaObject::invokeMethod<>(obj,"_q_startNextRequest",QueuedConnection);
  QHttpNetworkRequest::~QHttpNetworkRequest(&local_58.first);
  goto LAB_001eccd9;
}

Assistant:

void QHttpNetworkConnectionPrivate::removeReply(QHttpNetworkReply *reply)
{
    Q_Q(QHttpNetworkConnection);

    // check if the reply is currently being processed or it is pipelined in
    for (int i = 0; i < activeChannelCount; ++i) {
        // is the reply associated the currently processing of this channel?
        if (channels[i].reply == reply) {
            channels[i].reply = nullptr;
            if (channels[i].protocolHandler)
                channels[i].protocolHandler->setReply(nullptr);
            channels[i].request = QHttpNetworkRequest();
            channels[i].resendCurrent = false;

            if (!reply->isFinished() && !channels[i].alreadyPipelinedRequests.isEmpty()) {
                // the reply had to be prematurely removed, e.g. it was not finished
                // therefore we have to requeue the already pipelined requests.
                channels[i].requeueCurrentlyPipelinedRequests();
            }

            // if HTTP mandates we should close
            // or the reply is not finished yet, e.g. it was aborted
            // we have to close that connection
            if (reply->d_func()->isConnectionCloseEnabled() || !reply->isFinished()) {
                if (reply->isAborted()) {
                    channels[i].abort();
                } else {
                    channels[i].close();
                }
            }

            QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }

        // is the reply inside the pipeline of this channel already?
        for (int j = 0; j < channels[i].alreadyPipelinedRequests.size(); j++) {
            if (channels[i].alreadyPipelinedRequests.at(j).second == reply) {
               // Remove that HttpMessagePair
               channels[i].alreadyPipelinedRequests.removeAt(j);

               channels[i].requeueCurrentlyPipelinedRequests();

               // Since some requests had already been pipelined, but we removed
               // one and re-queued the others
               // we must force a connection close after the request that is
               // currently in processing has been finished.
               if (channels[i].reply)
                   channels[i].reply->d_func()->forceConnectionCloseEnabled = true;

               QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
               return;
            }
        }
        // is the reply inside the H2 pipeline of this channel already?
        const auto foundReply = [reply](const HttpMessagePair &pair) {
            return pair.second == reply;
        };
        auto &seq = channels[i].h2RequestsToSend;
        const auto end = seq.cend();
        auto it = std::find_if(seq.cbegin(), end, foundReply);
        if (it != end) {
            seq.erase(it);
            QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
    }
    // remove from the high priority queue
    if (!highPriorityQueue.isEmpty()) {
        for (int j = highPriorityQueue.size() - 1; j >= 0; --j) {
            HttpMessagePair messagePair = highPriorityQueue.at(j);
            if (messagePair.second == reply) {
                highPriorityQueue.removeAt(j);
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                return;
            }
        }
    }
    // remove from the low priority queue
    if (!lowPriorityQueue.isEmpty()) {
        for (int j = lowPriorityQueue.size() - 1; j >= 0; --j) {
            HttpMessagePair messagePair = lowPriorityQueue.at(j);
            if (messagePair.second == reply) {
                lowPriorityQueue.removeAt(j);
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                return;
            }
        }
    }
}